

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-util.cc
# Opt level: O2

bool tinyusdz::io::ReadWholeFile
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out,string *err,
               string *filepath,size_t filesize_max,void *userdata)

{
  unsigned_long __new_size;
  reference pvVar1;
  bool bVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  string local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  string local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream f;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&f,(filepath->_M_dataplus)._M_p,_S_bin);
  if ((abStack_218[*(long *)(_f + -0x18)] & 5) == 0) {
    std::istream::peek();
    if ((abStack_218[*(long *)(_f + -0x18)] & 5) == 0) {
      std::istream::seekg((long)&f,_S_beg);
      __new_size = std::istream::tellg();
      std::istream::seekg((long)&f,_S_beg);
      if ((long)__new_size < 0) {
        if (err != (string *)0x0) {
          std::operator+(&bStack_338,"Invalid file size : ",filepath);
          pcVar3 = " (does the path point to a directory?)";
          goto LAB_0016e5dc;
        }
      }
      else if (__new_size == 0x7fffffffffffffff) {
        if (err != (string *)0x0) {
          pcVar3 = "Invalid File(Pipe or special device?) : ";
          goto LAB_0016e5c7;
        }
      }
      else if (__new_size == 0) {
        if (err != (string *)0x0) {
          pcVar3 = "File is empty : ";
          goto LAB_0016e5c7;
        }
      }
      else if (filesize_max < __new_size && filesize_max != 0) {
        if (err != (string *)0x0) {
          std::operator+(&local_2d8,"File size is too large : ",filepath);
          std::operator+(&local_2b8,&local_2d8," sz = ");
          std::__cxx11::to_string(&local_2f8,__new_size);
          std::operator+(&local_278,&local_2b8,&local_2f8);
          std::operator+(&local_258,&local_278,", allowed max filesize = ");
          std::__cxx11::to_string(&local_298,filesize_max);
          std::operator+(&bStack_338,&local_258,&local_298);
          std::operator+(&local_318,&bStack_338,"\n");
          std::__cxx11::string::append((string *)err);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          goto LAB_0016e602;
        }
      }
      else {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(out,__new_size);
        pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(out,0);
        std::istream::read((char *)&f,(long)pvVar1);
        if ((abStack_218[*(long *)(_f + -0x18)] & 5) == 0) {
          bVar2 = true;
          goto LAB_0016e609;
        }
        if (err != (string *)0x0) {
          pcVar3 = "Failed to read file: ";
          goto LAB_0016e5c7;
        }
      }
    }
    else if (err != (string *)0x0) {
      pcVar3 = "File read error. Maybe empty file or invalid file : ";
      goto LAB_0016e5c7;
    }
  }
  else if (err != (string *)0x0) {
    pcVar3 = "File open error : ";
LAB_0016e5c7:
    std::operator+(&bStack_338,pcVar3,filepath);
    pcVar3 = "\n";
LAB_0016e5dc:
    std::operator+(&local_318,&bStack_338,pcVar3);
    std::__cxx11::string::append((string *)err);
    std::__cxx11::string::_M_dispose();
LAB_0016e602:
    std::__cxx11::string::_M_dispose();
  }
  bVar2 = false;
LAB_0016e609:
  std::ifstream::~ifstream(&f);
  return bVar2;
}

Assistant:

bool ReadWholeFile(std::vector<uint8_t> *out, std::string *err,
                   const std::string &filepath, size_t filesize_max,
                   void *userdata) {
  (void)userdata;

#ifdef TINYUSDZ_ANDROID_LOAD_FROM_ASSETS
  if (tinyusdz::io::asset_manager) {
    AAsset *asset = AAssetManager_open(asset_manager, filepath.c_str(),
                                       AASSET_MODE_STREAMING);
    if (!asset) {
      if (err) {
        (*err) += "File open error(from AssestManager) : " + filepath + "\n";
      }
      return false;
    }
    off_t len = AAsset_getLength(asset);
    if (len <= 0) {
      if (err) {
        (*err) += "Invalid file size : " + filepath +
                  " (does the path point to a directory?)";
      }
      return false;
    }
    size_t size = size_t(len);

    if (size >= filesize_max) {
      (*err) += "File size exceeds filesize_max : " + filepath +
                " (filesize_max " + std::to_string(filesize_max) + ")";

      return false;
    }

    out->resize(size);
    AAsset_read(asset, reinterpret_cast<char *>(&out->at(0)), size);
    AAsset_close(asset);
    return true;
  } else {
    if (err) {
      (*err) += "No asset manager specified : " + filepath + "\n";
    }
    return false;
  }

#else
#ifdef _WIN32
#if defined(__GLIBCXX__)  // mingw
  int file_descriptor =
      _wopen(UTF8ToWchar(filepath).c_str(), _O_RDONLY | _O_BINARY);
  __gnu_cxx::stdio_filebuf<char> wfile_buf(file_descriptor, std::ios_base::in);
  std::istream f(&wfile_buf);
#elif defined(_MSC_VER) || defined(_LIBCPP_VERSION)
  // For libcxx, assume _LIBCPP_HAS_OPEN_WITH_WCHAR is defined to accept
  // `wchar_t *`
  std::ifstream f(UTF8ToWchar(filepath).c_str(), std::ifstream::binary);
#else
  // Unknown compiler/runtime
  std::ifstream f(filepath.c_str(), std::ifstream::binary);
#endif
#else
  std::ifstream f(filepath.c_str(), std::ifstream::binary);
#endif
  if (!f) {
    if (err) {
      (*err) += "File open error : " + filepath + "\n";
    }
    return false;
  }

  // For directory(and pipe?), peek() will fail(Posix gnustl/libc++ only)
  int buf = f.peek();
  (void)buf;
  if (!f) {
    if (err) {
      (*err) +=
          "File read error. Maybe empty file or invalid file : " + filepath +
          "\n";
    }
    return false;
  }

  f.seekg(0, f.end);
  size_t sz = static_cast<size_t>(f.tellg());
  f.seekg(0, f.beg);

  if (int64_t(sz) < 0) {
    if (err) {
      (*err) += "Invalid file size : " + filepath +
                " (does the path point to a directory?)";
    }
    return false;
  } else if (sz == 0) {
    if (err) {
      (*err) += "File is empty : " + filepath + "\n";
    }
    return false;
  } else if (uint64_t(sz) >= uint64_t(std::numeric_limits<int64_t>::max())) {
    // Posixish environment.
    if (err) {
      (*err) += "Invalid File(Pipe or special device?) : " + filepath + "\n";
    }
    return false;
  }

  if ((filesize_max > 0) && (sz > filesize_max)) {
    if (err) {
      (*err) += "File size is too large : " + filepath +
                " sz = " + std::to_string(sz) +
                ", allowed max filesize = " + std::to_string(filesize_max) +
                "\n";
    }
    return false;
  }

  out->resize(sz);
  f.read(reinterpret_cast<char *>(&out->at(0)),
         static_cast<std::streamsize>(sz));

  if (!f) {
    // read failure.
    if (err) {
      (*err) += "Failed to read file: " + filepath + "\n";
    }
    return false;
  }

  return true;
#endif
}